

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool __thiscall ClipperLib::Clipper::ProcessIntersections(Clipper *this,cInt topY)

{
  bool bVar1;
  byte extraout_AL;
  byte bVar2;
  long lVar3;
  
  if (*(long *)(this->_vptr_Clipper[-3] + 0x10 +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) != 0
     ) {
    BuildIntersectList(this,topY);
    lVar3 = (long)(this->m_IntersectList).
                  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_IntersectList).
                  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
    if (lVar3 == 0) {
      bVar2 = 1;
LAB_00110475:
      bVar1 = false;
    }
    else {
      if (lVar3 != 1) {
        bVar1 = FixupIntersectionOrder(this);
        if (!bVar1) {
          bVar2 = 0;
          goto LAB_00110475;
        }
      }
      ProcessIntersectList(this);
      bVar1 = true;
      bVar2 = extraout_AL;
    }
    if (!bVar1) goto LAB_00110485;
    this->m_SortedEdges = (TEdge *)0x0;
  }
  bVar2 = 1;
LAB_00110485:
  return (bool)(bVar2 & 1);
}

Assistant:

bool Clipper::ProcessIntersections(const cInt topY)
{
  if( !m_ActiveEdges ) return true;
  try {
    BuildIntersectList(topY);
    size_t IlSize = m_IntersectList.size();
    if (IlSize == 0) return true;
    if (IlSize == 1 || FixupIntersectionOrder()) ProcessIntersectList();
    else return false;
  }
  catch(...) 
  {
    m_SortedEdges = 0;
    DisposeIntersectNodes();
    throw clipperException("ProcessIntersections error");
  }
  m_SortedEdges = 0;
  return true;
}